

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O0

void __thiscall cmGlobalNinjaGenerator::CheckNinjaCodePage(cmGlobalNinjaGenerator *this)

{
  string_view str;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  bool bVar1;
  bool bVar2;
  cmake *pcVar3;
  size_t __pos;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_440;
  cmListFileBacktrace local_408;
  allocator<char> local_3f1;
  string local_3f0;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_3d0;
  basic_string_view<char,_std::char_traits<char>_> local_3c0;
  size_t local_3b0;
  string_view encoding;
  string_view lineView;
  undefined1 local_378 [7];
  bool found;
  string line;
  istringstream outputStream;
  cmListFileBacktrace local_1d8;
  string_view local_1c0;
  string_view local_1b0;
  string local_1a0;
  cmAlphaNum local_180;
  cmAlphaNum local_150;
  string local_120;
  rep_conflict local_100;
  int local_f4;
  undefined1 local_f0 [4];
  int result;
  string error;
  string output;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  string local_78 [32];
  string local_58 [32];
  iterator local_38;
  size_type local_30;
  undefined1 local_28 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  command;
  cmGlobalNinjaGenerator *this_local;
  
  output.field_2._M_local_buf[9] = '\x01';
  command.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::__cxx11::string::string((string *)&local_98,(string *)&this->NinjaCommand);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_78,"-t",(allocator<char> *)(output.field_2._M_local_buf + 0xb));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_58,"wincodepage",(allocator<char> *)(output.field_2._M_local_buf + 10));
  output.field_2._M_local_buf[9] = '\0';
  local_38 = &local_98;
  local_30 = 3;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)(output.field_2._M_local_buf + 8));
  __l._M_len = local_30;
  __l._M_array = local_38;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_28,__l,
           (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)(output.field_2._M_local_buf + 8));
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)(output.field_2._M_local_buf + 8));
  local_440 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_38;
  do {
    local_440 = local_440 + -1;
    std::__cxx11::string::~string((string *)local_440);
  } while (local_440 != &local_98);
  std::allocator<char>::~allocator((allocator<char> *)(output.field_2._M_local_buf + 10));
  std::allocator<char>::~allocator((allocator<char> *)(output.field_2._M_local_buf + 0xb));
  std::__cxx11::string::string((string *)(error.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)local_f0);
  local_100 = (rep_conflict)std::chrono::duration<double,_std::ratio<1L,_1L>_>::zero();
  bVar1 = cmSystemTools::RunSingleCommand
                    ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_28,(string *)(error.field_2._M_local_buf + 8),(string *)local_f0,
                     &local_f4,(char *)0x0,OUTPUT_NONE,(cmDuration)local_100,Auto);
  if (bVar1) {
    if (local_f4 == 0) {
      std::__cxx11::istringstream::istringstream
                ((istringstream *)(line.field_2._M_local_buf + 8),
                 (string *)(error.field_2._M_local_buf + 8),_S_in);
      std::__cxx11::string::string((string *)local_378);
      bVar1 = false;
      do {
        bVar2 = cmsys::SystemTools::GetLineFromStream
                          ((istream *)(line.field_2._M_local_buf + 8),(string *)local_378,
                           (bool *)0x0,0xffffffffffffffff);
        if (!bVar2) goto LAB_0069fe3c;
        str = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_378);
        bVar2 = cmHasLiteralPrefix<22ul>(str,(char (*) [22])"Build file encoding: ");
      } while (!bVar2);
      encoding._M_str =
           (char *)std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_378);
      __pos = cmStrLen<22ul>((char (*) [22])"Build file encoding: ");
      local_3c0 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                            ((basic_string_view<char,_std::char_traits<char>_> *)&encoding._M_str,
                             __pos,0xffffffffffffffff);
      encoding._M_len = (size_t)local_3c0._M_str;
      local_3b0 = local_3c0._M_len;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_3d0,"UTF-8");
      bVar1 = std::operator==(local_3c0,local_3d0);
      if (bVar1) {
        this->NinjaExpectedEncoding = None;
      }
      else {
        this->NinjaExpectedEncoding = ANSI;
      }
      bVar1 = true;
LAB_0069fe3c:
      if (!bVar1) {
        pcVar3 = cmGlobalGenerator::GetCMakeInstance((cmGlobalGenerator *)this);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_3f0,
                   "Could not determine Ninja\'s code page, defaulting to UTF-8",&local_3f1);
        local_408.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
        super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)0x0;
        local_408.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
        super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        cmListFileBacktrace::cmListFileBacktrace(&local_408);
        cmake::IssueMessage(pcVar3,WARNING,&local_3f0,&local_408);
        cmListFileBacktrace::~cmListFileBacktrace(&local_408);
        std::__cxx11::string::~string((string *)&local_3f0);
        std::allocator<char>::~allocator(&local_3f1);
        this->NinjaExpectedEncoding = None;
      }
      std::__cxx11::string::~string((string *)local_378);
      std::__cxx11::istringstream::~istringstream((istringstream *)(line.field_2._M_local_buf + 8));
    }
    else {
      this->NinjaExpectedEncoding = ANSI;
    }
  }
  else {
    pcVar3 = cmGlobalGenerator::GetCMakeInstance((cmGlobalGenerator *)this);
    cmAlphaNum::cmAlphaNum(&local_150,"Running\n \'");
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_1b0,"\' \'");
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_1c0);
    cmJoin(&local_1a0,
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_28,local_1b0,local_1c0);
    cmAlphaNum::cmAlphaNum(&local_180,&local_1a0);
    cmStrCat<char[17],std::__cxx11::string>
              (&local_120,&local_150,&local_180,(char (*) [17])"\'\nfailed with:\n ",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f0);
    local_1d8.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
    super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)0x0;
    local_1d8.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
    super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    cmListFileBacktrace::cmListFileBacktrace(&local_1d8);
    cmake::IssueMessage(pcVar3,FATAL_ERROR,&local_120,&local_1d8);
    cmListFileBacktrace::~cmListFileBacktrace(&local_1d8);
    std::__cxx11::string::~string((string *)&local_120);
    std::__cxx11::string::~string((string *)&local_1a0);
    cmSystemTools::SetFatalErrorOccurred();
  }
  std::__cxx11::string::~string((string *)local_f0);
  std::__cxx11::string::~string((string *)(error.field_2._M_local_buf + 8));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_28);
  return;
}

Assistant:

void cmGlobalNinjaGenerator::CheckNinjaCodePage()
{
  std::vector<std::string> command{ this->NinjaCommand, "-t", "wincodepage" };
  std::string output;
  std::string error;
  int result;
  if (!cmSystemTools::RunSingleCommand(command, &output, &error, &result,
                                       nullptr, cmSystemTools::OUTPUT_NONE)) {
    this->GetCMakeInstance()->IssueMessage(MessageType::FATAL_ERROR,
                                           cmStrCat("Running\n '",
                                                    cmJoin(command, "' '"),
                                                    "'\n"
                                                    "failed with:\n ",
                                                    error));
    cmSystemTools::SetFatalErrorOccurred();
  } else if (result == 0) {
    std::istringstream outputStream(output);
    std::string line;
    bool found = false;
    while (cmSystemTools::GetLineFromStream(outputStream, line)) {
      if (cmHasLiteralPrefix(line, "Build file encoding: ")) {
        cm::string_view lineView(line);
        cm::string_view encoding =
          lineView.substr(cmStrLen("Build file encoding: "));
        if (encoding == "UTF-8") {
          // Ninja expects UTF-8. We use that internally. No conversion needed.
          this->NinjaExpectedEncoding = codecvt::None;
        } else {
          this->NinjaExpectedEncoding = codecvt::ANSI;
        }
        found = true;
        break;
      }
    }
    if (!found) {
      this->GetCMakeInstance()->IssueMessage(
        MessageType::WARNING,
        "Could not determine Ninja's code page, defaulting to UTF-8");
      this->NinjaExpectedEncoding = codecvt::None;
    }
  } else {
    this->NinjaExpectedEncoding = codecvt::ANSI;
  }
}